

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_>::freeData
          (Span<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *this)

{
  Entry *pEVar1;
  ulong uVar2;
  long lVar3;
  
  if (this->entries != (Entry *)0x0) {
    lVar3 = 0;
    do {
      if (this->offsets[lVar3] != 0xff) {
        pEVar1 = this->entries;
        uVar2 = (ulong)((uint)this->offsets[lVar3] * 0x90);
        QPainterPath::~QPainterPath((QPainterPath *)((pEVar1->storage).data + uVar2 + 0x88));
        QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer
                  ((QSharedDataPointer<QStyleSheetImageData> *)
                   ((pEVar1->storage).data + uVar2 + 0x78));
        QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer
                  ((QSharedDataPointer<QStyleSheetImageData> *)
                   ((pEVar1->storage).data + uVar2 + 0x70));
        QSharedDataPointer<QStyleSheetPositionData>::~QSharedDataPointer
                  ((QSharedDataPointer<QStyleSheetPositionData> *)
                   ((pEVar1->storage).data + uVar2 + 0x68));
        QSharedDataPointer<QStyleSheetGeometryData>::~QSharedDataPointer
                  ((QSharedDataPointer<QStyleSheetGeometryData> *)
                   ((pEVar1->storage).data + uVar2 + 0x60));
        QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer
                  ((QSharedDataPointer<QStyleSheetOutlineData> *)
                   ((pEVar1->storage).data + uVar2 + 0x58));
        QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer
                  ((QSharedDataPointer<QStyleSheetBorderData> *)
                   ((pEVar1->storage).data + uVar2 + 0x50));
        QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer
                  ((QSharedDataPointer<QStyleSheetBackgroundData> *)
                   ((pEVar1->storage).data + uVar2 + 0x48));
        QSharedDataPointer<QStyleSheetBoxData>::~QSharedDataPointer
                  ((QSharedDataPointer<QStyleSheetBoxData> *)((pEVar1->storage).data + uVar2 + 0x40)
                  );
        QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer
                  ((QSharedDataPointer<QStyleSheetPaletteData> *)
                   ((pEVar1->storage).data + uVar2 + 0x38));
        QHash<QString,_QVariant>::~QHash
                  ((QHash<QString,_QVariant> *)((pEVar1->storage).data + uVar2 + 0x30));
        QFont::~QFont((QFont *)((pEVar1->storage).data + uVar2 + 0x18));
        QBrush::~QBrush((QBrush *)((pEVar1->storage).data + uVar2 + 0x10));
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }